

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::GenerateSerializedSizeCode
          (ImmutableEnumOneofFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_ImmutableEnumFieldGenerator).variables_,
                     "if ($has_oneof_case_message$) {\n  size += com.google.protobuf.CodedOutputStream\n    .computeEnumSize($number$, ((java.lang.Integer) $oneof_name$_));\n}\n"
                    );
  return;
}

Assistant:

void ImmutableEnumOneofFieldGenerator::GenerateSerializedSizeCode(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "if ($has_oneof_case_message$) {\n"
      "  size += com.google.protobuf.CodedOutputStream\n"
      "    .computeEnumSize($number$, ((java.lang.Integer) $oneof_name$_));\n"
      "}\n");
}